

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::HasProperty
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance,JavascriptString *propertyNameString)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  uint uVar4;
  char16 *pcVar5;
  undefined4 *puVar6;
  undefined1 local_40 [8];
  CharacterBuffer<char16_t> propertyName;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  
  pcVar5 = JavascriptString::GetString(propertyNameString);
  cVar3 = JavascriptString::GetLength(propertyNameString);
  bVar2 = PropertyRecord::IsPropertyNameNumeric(pcVar5,cVar3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x46f,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  pcVar5 = JavascriptString::GetString(propertyNameString);
  cVar3 = JavascriptString::GetLength(propertyNameString);
  Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierSet
            ((WriteBarrierPtr<const_char16_t> *)local_40,pcVar5);
  propertyName.string.ptr._0_4_ = cVar3;
  bVar2 = JsUtil::
          BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<JsUtil::CharacterBuffer<char16_t>>
                    ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,(CharacterBuffer<char16_t> *)local_40,
                     (SimpleDictionaryPropertyDescriptor<unsigned_short> **)&propertyName.len);
  uVar4 = 0;
  if (bVar2) {
    uVar4 = (uint)((*(byte *)(propertyName._8_8_ + 1) & 0x18) == 0);
  }
  return uVar4;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::HasProperty(DynamicObject* instance, JavascriptString* propertyNameString)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter");

        JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        if (propertyMap->TryGetReference(propertyName, &descriptor))
        {
            if (descriptor->Attributes & (PropertyDeleted | PropertyLetConstGlobal))
            {
                return false;
            }
            return true;
        }

        return false;
    }